

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

hash_t __thiscall
TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
CountUsed(TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
          *this)

{
  hash_t hVar1;
  hash_t hVar2;
  Node *pNVar3;
  
  hVar2 = this->Size;
  if (hVar2 == 0) {
    hVar1 = 0;
  }
  else {
    pNVar3 = this->Nodes;
    hVar1 = 0;
    do {
      hVar1 = hVar1 + (pNVar3->Next != (Node *)0x1);
      pNVar3 = pNVar3 + 1;
      hVar2 = hVar2 - 1;
    } while (hVar2 != 0);
  }
  if (hVar1 != this->NumUsed) {
    __assert_fail("used == NumUsed",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                  ,0x2ba,
                  "hash_t TMap<FName, FOptionalMapinfoDataPtr>::CountUsed() const [KT = FName, VT = FOptionalMapinfoDataPtr, HashTraits = THashTraits<FName>, ValueTraits = TValueTraits<FOptionalMapinfoDataPtr>]"
                 );
  }
  return hVar1;
}

Assistant:

hash_t CountUsed() const
	{
#ifdef _DEBUG
		hash_t used = 0;
		hash_t ct = Size;
		for (Node *n = Nodes; ct-- > 0; ++n)
		{
			if (!n->IsNil())
			{
				++used;
			}
		}
		assert (used == NumUsed);
#endif
		return NumUsed;
	}